

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O1

void __thiscall SemanticTypes::visit(SemanticTypes *this,CallNode *callNode)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TokenNode *pTVar5;
  PointerNode *pPVar6;
  ExpNode *pEVar7;
  ArrayNode *pAVar8;
  int iVar9;
  FunctionSymbol *pFVar10;
  byte bVar11;
  ExpListNode *pEVar12;
  bool bVar13;
  FormalListNode *pFVar14;
  bool bVar15;
  bool bVar16;
  
  pTVar5 = callNode->id;
  if (pTVar5 == (TokenNode *)0x0) {
    visit((SemanticTypes *)callNode);
  }
  else {
    (*(pTVar5->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pTVar5,this);
    pEVar12 = callNode->parameters;
    if (pEVar12 != (ExpListNode *)0x0) {
      (*(pEVar12->super_ASTNode)._vptr_ASTNode[3])(pEVar12,this);
    }
    pFVar10 = FunctionTable::cSearch(functionTable,(callNode->id->super_ExpNode).lexeme);
    if (pFVar10 == (FunctionSymbol *)0x0) {
      visit();
    }
    else {
      pFVar14 = pFVar10->varDecl;
      pEVar12 = callNode->parameters;
      do {
        if ((pFVar14 == (FormalListNode *)0x0) || (pEVar12 == (ExpListNode *)0x0)) {
          if (pFVar14 == (FormalListNode *)0x0 && pEVar12 == (ExpListNode *)0x0) {
            if ((activeFunction != (FunctionSymbol *)0x0) &&
               (activeFunction->callSize < pFVar10->paramSize)) {
              activeFunction->callSize = pFVar10->paramSize;
            }
            (callNode->super_ExpNode).lexeme = (callNode->id->super_ExpNode).lexeme;
            pTVar5 = pFVar10->returnType->id;
            (callNode->super_ExpNode).type = pTVar5->token;
            (callNode->super_ExpNode).typeLexeme = (pTVar5->super_ExpNode).typeLexeme;
            (callNode->super_ExpNode).pointer = pFVar10->pointer;
            (callNode->super_ExpNode).arraySize = -1;
            (callNode->super_ExpNode).lValue = false;
            return;
          }
          visit();
          return;
        }
        (*(pEVar12->super_ASTNode)._vptr_ASTNode[3])(pEVar12,this);
        pPVar6 = pFVar14->pointer;
        pTVar5 = pFVar14->type->id;
        iVar2 = pTVar5->token;
        pEVar7 = pEVar12->exp;
        iVar3 = pEVar7->type;
        pAVar8 = pFVar14->array;
        iVar4 = pEVar7->arraySize;
        bVar1 = pEVar7->pointer;
        if (iVar2 == 10) {
          iVar9 = strcmp((pTVar5->super_ExpNode).typeLexeme,pEVar7->typeLexeme);
          bVar15 = iVar9 != 0;
        }
        else {
          bVar15 = false;
        }
        bVar16 = iVar2 != iVar3;
        bVar13 = 0 < iVar4 != (pAVar8 != (ArrayNode *)0x0);
        bVar11 = pPVar6 != (PointerNode *)0x0 ^ bVar1;
        if ((((bVar11 & 1) != 0 || bVar13) || bVar15) || bVar16) {
          visit();
        }
        else {
          pEVar12 = pEVar12->next;
          pFVar14 = pFVar14->next;
        }
      } while ((((bVar11 & 1) == 0 && !bVar13) && !bVar15) && !bVar16);
    }
  }
  return;
}

Assistant:

void SemanticTypes::visit(CallNode *callNode) {

    if (callNode->getId()) {
        callNode->getId()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - callNode] INVALID FUNCTION CALL, line %d\n", callNode->getLine());
        return;
    }

    if (callNode->getParameters()) {
        callNode->getParameters()->accept(this);
    }

    FunctionSymbol *func = functionTable->cSearch(callNode->getId()->getLexeme());

    if (!func) {
        fprintf(stderr, "[SEMANTIC ERROR - callNode] CALL TO UNDEFINED FUNCTION, line: %d lexeme: %s\n",
                callNode->getLine(), callNode->getId()->getLexeme());
        return;
    }

    FormalListNode *expectedParameter = func->getVarDecl();
    ExpListNode *parameter = callNode->getParameters();

    while (expectedParameter && parameter) {

        parameter->accept(this);

        bool isSameType = expectedParameter->getParameterType() == parameter->getExp()->getType();
        bool isSameArray = (expectedParameter->getArray() != NULL) == (parameter->getExp()->getArraySize() > 0);
        bool isSamePointer = (expectedParameter->getPointer() != NULL) == parameter->getExp()->isPointer();
        bool isSameTypeLexeme = true;

        if (expectedParameter->getParameterType() == ID)
            isSameTypeLexeme = !strcmp(expectedParameter->getParameterTypeLexeme(),
                                       parameter->getExp()->getTypeLexeme());

        if (!(isSameArray && isSamePointer && isSameType && isSameTypeLexeme)) {
            fprintf(stderr, "[SEMANTIC ERROR - callNode] PARAMETER TYPE MISMATCH, line: %d parameter: %s\n",
                    parameter->getLine(), expectedParameter->getId()->getLexeme());
            return;
        }

        parameter = parameter->getNext();
        expectedParameter = expectedParameter->getNext();
    }

    if (expectedParameter || parameter) {
        fprintf(stderr, "[SEMANTIC ERROR - callNode] PARAMETER COUNT MISMATCH, line: %d lexeme: %s\n",
                callNode->getLine(), callNode->getId()->getLexeme());
        return;
    }

    //Inform the caller the needed params size
    if(activeFunction) {
        activeFunction->setCallSize(func->getParamSize());
    }

    callNode->setLexeme(callNode->getId()->getLexeme());
    callNode->setType(func->getReturnType()->getType());
    callNode->setTypeLexeme(func->getReturnType()->getTypeLexeme());
    callNode->setPointer(func->isPointer());
    callNode->setArraySize(-1);
    callNode->setLValue(false);
}